

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

SystemTimingCheckSyntax * __thiscall slang::parsing::Parser::parseSystemTimingCheck(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token openParen_00;
  Token name_00;
  Token closeParen_00;
  Token semi;
  Info *pIVar1;
  SystemTimingCheckSyntax *pSVar2;
  long in_RDI;
  Token TVar3;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_000000e0;
  Token *in_stack_000000e8;
  TokenKind in_stack_000000f2;
  TokenKind in_stack_000000f4;
  TokenKind in_stack_000000f6;
  ParserBase *in_stack_000000f8;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> list;
  Token closeParen;
  Token openParen;
  Token name;
  Token *in_stack_fffffffffffffeb0;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *this_00;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffebc;
  __extent_storage<18446744073709551615UL> this_01;
  ParserBase *in_stack_fffffffffffffed0;
  SyntaxFactory *local_118;
  TokenKind in_stack_ffffffffffffff3e;
  ParserBase *in_stack_ffffffffffffff40;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_58;
  Token local_18;
  
  local_18 = ParserBase::consume(in_stack_fffffffffffffed0);
  Token::Token(in_stack_fffffffffffffeb0);
  Token::Token(in_stack_fffffffffffffeb0);
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
            ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x6e2ae8);
  local_58.super_SyntaxListBase.super_SyntaxNode._4_4_ = 0x10001;
  this_01._M_extent_value = (size_t)&local_58;
  this_00 = (SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)CONCAT44(uVar4,1);
  uVar4 = 0x10001;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleTimingCheckArg,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseSystemTimingCheck()::__0>
            (in_stack_000000f8,in_stack_000000f6,in_stack_000000f4,in_stack_000000f2,
             in_stack_000000e8,in_stack_000000e0,(Token *)list._M_ptr,
             (RequireItems)list._M_extent._M_extent_value,(DiagCode)closeParen._0_4_,
             (anon_class_8_1_8991fb9c *)closeParen.info,openParen._0_4_);
  pIVar1 = (Info *)(in_RDI + 0xe0);
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_01._M_extent_value,
             (nullptr_t)CONCAT44(in_stack_fffffffffffffebc,uVar4));
  elements._M_ptr._4_4_ = in_stack_fffffffffffffebc;
  elements._M_ptr._0_4_ = uVar4;
  elements._M_extent._M_extent_value = this_01._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::SeparatedSyntaxList
            (this_00,elements);
  TVar3 = ParserBase::expect(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e);
  local_118 = TVar3._0_8_;
  name_00.info = pIVar1;
  name_00.kind = (short)in_RDI;
  name_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
  name_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  name_00.rawLen = (int)((ulong)in_RDI >> 0x20);
  openParen_00.info = (Info *)in_stack_fffffffffffffed0;
  openParen_00._0_8_ = (SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)TVar3.info;
  closeParen_00.info =
       (Info *)local_58.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
               ._M_ptr;
  closeParen_00.kind = (short)local_58.super_SyntaxListBase.childCount;
  closeParen_00._2_1_ = (char)(local_58.super_SyntaxListBase.childCount >> 0x10);
  closeParen_00.numFlags.raw = (char)(local_58.super_SyntaxListBase.childCount >> 0x18);
  closeParen_00.rawLen = (int)(local_58.super_SyntaxListBase.childCount >> 0x20);
  semi.info = (Info *)local_58.super_SyntaxListBase.super_SyntaxNode.previewNode;
  semi._0_8_ = local_58.super_SyntaxListBase.super_SyntaxNode.parent;
  pSVar2 = slang::syntax::SyntaxFactory::systemTimingCheck
                     (local_118,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                      local_58.
                      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                      _M_ptr,name_00,openParen_00,
                      (SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)TVar3.info,
                      closeParen_00,semi);
  return pSVar2;
}

Assistant:

SystemTimingCheckSyntax& Parser::parseSystemTimingCheck() {
    auto name = consume();

    Token openParen, closeParen;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleTimingCheckArg, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, list,
        closeParen, RequireItems::True, diag::ExpectedExpression,
        [this] { return &parseTimingCheckArg(); }, AllowEmpty::True);

    return factory.systemTimingCheck(nullptr, name, openParen, list, closeParen,
                                     expect(TokenKind::Semicolon));
}